

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_vote_req(raft_server *this,req_msg *req)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int32 voted_for;
  element_type *peVar4;
  ulong uVar5;
  element_type *peVar6;
  element_type *peVar7;
  ulong uVar8;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__addr_len;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  element_type *this_00;
  __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  bool bVar10;
  ptr<resp_msg> pVar11;
  bool grant;
  bool log_okay;
  ptr<resp_msg> *resp;
  int *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  unsigned_long *in_stack_fffffffffffffee8;
  bool local_b9;
  bool local_a1;
  undefined1 local_68 [16];
  undefined1 local_58 [39];
  byte local_31;
  int32 local_30;
  undefined4 local_2c;
  ulong local_28;
  undefined1 local_19;
  req_msg *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  peVar4 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d5c06);
  local_28 = srv_state::get_term(peVar4);
  local_2c = 2;
  local_30 = msg_base::get_src(&local_18->super_msg_base);
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
            (in_stack_fffffffffffffee8,
             (msg_type *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  bVar10 = false;
  uVar5 = req_msg::get_last_log_term(local_18);
  peVar6 = std::
           __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d5cac);
  (*peVar6->_vptr_log_store[4])(local_58);
  peVar7 = std::
           __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d5ccf);
  uVar8 = log_entry::get_term(peVar7);
  local_a1 = true;
  if (uVar5 <= uVar8) {
    uVar5 = req_msg::get_last_log_term(local_18);
    peVar6 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d5d2e);
    (*peVar6->_vptr_log_store[4])(local_68);
    bVar10 = true;
    peVar7 = std::
             __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d5d59);
    uVar8 = log_entry::get_term(peVar7);
    local_b9 = false;
    if (uVar5 == uVar8) {
      peVar6 = std::
               __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d5d9a);
      iVar1 = (*peVar6->_vptr_log_store[2])();
      uVar5 = req_msg::get_last_log_idx(local_18);
      local_b9 = CONCAT44(extraout_var,iVar1) - 1U <= uVar5;
    }
    local_a1 = local_b9;
  }
  if (bVar10) {
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x1d5e11);
  }
  std::shared_ptr<cornerstone::log_entry>::~shared_ptr
            ((shared_ptr<cornerstone::log_entry> *)0x1d5e1e);
  local_31 = local_a1;
  __addr_len = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               msg_base::get_term(&local_18->super_msg_base);
  peVar4 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d5e53);
  _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)srv_state::get_term(peVar4);
  bVar10 = false;
  if ((__addr_len == _Var9._M_pi) && (bVar10 = false, (local_31 & 1) != 0)) {
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d5e9f);
    uVar2 = srv_state::get_voted_for(peVar4);
    uVar3 = msg_base::get_src(&local_18->super_msg_base);
    __addr_len = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar2;
    _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar3;
    bVar10 = true;
    if (uVar2 != uVar3) {
      peVar4 = std::
               __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d5ee6);
      iVar1 = srv_state::get_voted_for(peVar4);
      bVar10 = iVar1 == -1;
      _Var9._M_pi = extraout_RDX;
    }
  }
  if (bVar10) {
    this_00 = std::
              __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d5f32);
    peVar6 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d5f4b);
    iVar1 = (*peVar6->_vptr_log_store[2])();
    resp_msg::accept(this_00,iVar1,__addr,(socklen_t *)__addr_len);
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d5f83);
    voted_for = msg_base::get_src(&local_18->super_msg_base);
    srv_state::set_voted_for(peVar4,voted_for);
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1d5fbc);
    this_01 = (__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d5fc4);
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(this_01);
    (**(code **)(*(long *)this_01 + 0x20))(this_01,peVar4);
    _Var9._M_pi = extraout_RDX_00;
  }
  pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_vote_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::vote_response, id_, req.get_src()));
    bool log_okay = req.get_last_log_term() > log_store_->last_entry()->get_term() ||
                    (req.get_last_log_term() == log_store_->last_entry()->get_term() &&
                     log_store_->next_slot() - 1 <= req.get_last_log_idx());
    bool grant = req.get_term() == state_->get_term() && log_okay &&
                 (state_->get_voted_for() == req.get_src() || state_->get_voted_for() == -1);
    if (grant)
    {
        resp->accept(log_store_->next_slot());
        state_->set_voted_for(req.get_src());
        ctx_->state_mgr_->save_state(*state_);
    }

    return resp;
}